

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void dropColumnFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  sqlite3_xauth p_Var1;
  int iVar2;
  int iVar3;
  sqlite3 *db_00;
  uchar *zSql_00;
  RenameToken *pRVar4;
  RenameToken *pRVar5;
  char *pcVar6;
  bool bVar7;
  RenameToken *pEnd;
  sqlite3_xauth xAuth;
  char *zNew;
  char *zEnd;
  Table *pTab;
  RenameToken *pCol;
  Parse sParse;
  int rc;
  char *zDb;
  int iCol;
  char *zSql;
  int iSchema;
  sqlite3 *db;
  sqlite3_value **argv_local;
  int NotUsed_local;
  sqlite3_context *context_local;
  
  db_00 = sqlite3_context_db_handle(context);
  iVar2 = sqlite3_value_int(*argv);
  zSql_00 = sqlite3_value_text(argv[1]);
  iVar3 = sqlite3_value_int(argv[2]);
  pcVar6 = db_00->aDb[iVar2].zDbSName;
  p_Var1 = db_00->xAuth;
  db_00->xAuth = (sqlite3_xauth)0x0;
  sParse.pRename._4_4_ =
       renameParseSql((Parse *)&pCol,pcVar6,db_00,(char *)zSql_00,(uint)(iVar2 == 1));
  if (sParse.pRename._4_4_ == 0) {
    if (((sParse.zTail == (char *)0x0) || (*(short *)(sParse.zTail + 0x36) == 1)) ||
       (*(short *)(sParse.zTail + 0x36) <= iVar3)) {
      sParse.pRename._4_4_ = sqlite3CorruptError(0x1bbef);
    }
    else {
      pRVar4 = renameTokenFind((Parse *)&pCol,(RenameCtx *)0x0,
                               *(void **)(*(long *)(sParse.zTail + 8) + (long)iVar3 * 0x10));
      if (iVar3 < *(short *)(sParse.zTail + 0x36) + -1) {
        pRVar5 = renameTokenFind((Parse *)&pCol,(RenameCtx *)0x0,
                                 *(void **)(*(long *)(sParse.zTail + 8) + (long)(iVar3 + 1) * 0x10))
        ;
        zNew = (pRVar5->t).z;
      }
      else {
        zNew = (char *)(zSql_00 + *(int *)(sParse.zTail + 0x40));
        while( true ) {
          bVar7 = false;
          if (*(pRVar4->t).z != '\0') {
            bVar7 = *(pRVar4->t).z != ',';
          }
          if (!bVar7) break;
          (pRVar4->t).z = (pRVar4->t).z + -1;
        }
      }
      pcVar6 = sqlite3MPrintf(db_00,"%.*s%s",(long)(pRVar4->t).z - (long)zSql_00,zSql_00,zNew);
      sqlite3_result_text(context,pcVar6,-1,(_func_void_void_ptr *)0xffffffffffffffff);
      sqlite3_free(pcVar6);
    }
  }
  renameParseCleanup((Parse *)&pCol);
  db_00->xAuth = p_Var1;
  if (sParse.pRename._4_4_ != 0) {
    sqlite3_result_error_code(context,sParse.pRename._4_4_);
  }
  return;
}

Assistant:

static void dropColumnFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  sqlite3 *db = sqlite3_context_db_handle(context);
  int iSchema = sqlite3_value_int(argv[0]);
  const char *zSql = (const char*)sqlite3_value_text(argv[1]);
  int iCol = sqlite3_value_int(argv[2]);
  const char *zDb = db->aDb[iSchema].zDbSName;
  int rc;
  Parse sParse;
  RenameToken *pCol;
  Table *pTab;
  const char *zEnd;
  char *zNew = 0;

#ifndef SQLITE_OMIT_AUTHORIZATION
  sqlite3_xauth xAuth = db->xAuth;
  db->xAuth = 0;
#endif

  UNUSED_PARAMETER(NotUsed);
  rc = renameParseSql(&sParse, zDb, db, zSql, iSchema==1);
  if( rc!=SQLITE_OK ) goto drop_column_done;
  pTab = sParse.pNewTable;
  if( pTab==0 || pTab->nCol==1 || iCol>=pTab->nCol ){
    /* This can happen if the sqlite_schema table is corrupt */
    rc = SQLITE_CORRUPT_BKPT;
    goto drop_column_done;
  }

  pCol = renameTokenFind(&sParse, 0, (void*)pTab->aCol[iCol].zCnName);
  if( iCol<pTab->nCol-1 ){
    RenameToken *pEnd;
    pEnd = renameTokenFind(&sParse, 0, (void*)pTab->aCol[iCol+1].zCnName);
    zEnd = (const char*)pEnd->t.z;
  }else{
    assert( IsOrdinaryTable(pTab) );
    zEnd = (const char*)&zSql[pTab->u.tab.addColOffset];
    while( ALWAYS(pCol->t.z[0]!=0) && pCol->t.z[0]!=',' ) pCol->t.z--;
  }

  zNew = sqlite3MPrintf(db, "%.*s%s", pCol->t.z-zSql, zSql, zEnd);
  sqlite3_result_text(context, zNew, -1, SQLITE_TRANSIENT);
  sqlite3_free(zNew);

drop_column_done:
  renameParseCleanup(&sParse);
#ifndef SQLITE_OMIT_AUTHORIZATION
  db->xAuth = xAuth;
#endif
  if( rc!=SQLITE_OK ){
    sqlite3_result_error_code(context, rc);
  }
}